

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void PropagateLabel(ON_Brep *B,ON_SimpleArray<int> *fids,int label,ON_SimpleArray<int> *new_fids)

{
  ON_SimpleArray<int> *this;
  int iVar1;
  int iVar2;
  ON_ClassArray<ON_BrepFace> *this_00;
  int *piVar3;
  ON_ClassArray<ON_BrepLoop> *this_01;
  ON_ClassArray<ON_BrepTrim> *pOVar4;
  ON_BrepTrim *this_02;
  ON_BrepFace *pOVar5;
  ON_BrepFace *F_local;
  int fi;
  int trim_i;
  ON_BrepVertex *V;
  ON_BrepEdge *pOStack_60;
  int vertex_i;
  ON_BrepEdge *E;
  ON_BrepTrim *T;
  ON_BrepLoop *pOStack_48;
  int edge_i;
  ON_BrepLoop *L;
  ON_BrepFace *pOStack_38;
  int loop_i;
  ON_BrepFace *F;
  ON_SimpleArray<int> *pOStack_28;
  int face_i;
  ON_SimpleArray<int> *new_fids_local;
  ON_SimpleArray<int> *pOStack_18;
  int label_local;
  ON_SimpleArray<int> *fids_local;
  ON_Brep *B_local;
  
  pOStack_28 = new_fids;
  new_fids_local._4_4_ = label;
  pOStack_18 = fids;
  fids_local = (ON_SimpleArray<int> *)B;
  iVar1 = ON_SimpleArray<int>::Count(fids);
  if (iVar1 != 0) {
    ON_SimpleArray<int>::SetCount(pOStack_28,0);
    this = pOStack_28;
    iVar1 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)(fids_local + 8));
    ON_SimpleArray<int>::Reserve(this,(long)iVar1);
    for (F._4_4_ = 0; iVar1 = F._4_4_, iVar2 = ON_SimpleArray<int>::Count(pOStack_18), iVar1 < iVar2
        ; F._4_4_ = F._4_4_ + 1) {
      this_00 = (ON_ClassArray<ON_BrepFace> *)(fids_local + 8);
      piVar3 = ON_SimpleArray<int>::operator[](pOStack_18,F._4_4_);
      pOStack_38 = ON_ClassArray<ON_BrepFace>::operator[](this_00,*piVar3);
      for (L._4_4_ = 0; iVar1 = L._4_4_, iVar2 = ON_SimpleArray<int>::Count(&pOStack_38->m_li),
          iVar1 < iVar2; L._4_4_ = L._4_4_ + 1) {
        this_01 = (ON_ClassArray<ON_BrepLoop> *)(fids_local + 7);
        piVar3 = ON_SimpleArray<int>::operator[](&pOStack_38->m_li,L._4_4_);
        pOStack_48 = ON_ClassArray<ON_BrepLoop>::operator[](this_01,*piVar3);
        memset(&pOStack_48->m_loop_user,0,8);
        (pOStack_48->m_loop_user).i = new_fids_local._4_4_;
        for (T._4_4_ = 0; iVar1 = T._4_4_, iVar2 = ON_SimpleArray<int>::Count(&pOStack_48->m_ti),
            iVar1 < iVar2; T._4_4_ = T._4_4_ + 1) {
          pOVar4 = (ON_ClassArray<ON_BrepTrim> *)(fids_local + 6);
          piVar3 = ON_SimpleArray<int>::operator[](&pOStack_48->m_ti,T._4_4_);
          E = (ON_BrepEdge *)ON_ClassArray<ON_BrepTrim>::operator[](pOVar4,*piVar3);
          memset(&((ON_BrepTrim *)E)->m_trim_user,0,8);
          (E->m_edge_user).i = new_fids_local._4_4_;
          if (-1 < E->m_vi[0]) {
            pOStack_60 = ON_ClassArray<ON_BrepEdge>::operator[]
                                   ((ON_ClassArray<ON_BrepEdge> *)(fids_local + 5),E->m_vi[0]);
            memset(&pOStack_60->m_edge_user,0,8);
            (pOStack_60->m_edge_user).i = new_fids_local._4_4_;
            for (V._4_4_ = 0; V._4_4_ < 2; V._4_4_ = V._4_4_ + 1) {
              if (-1 < pOStack_60->m_vi[V._4_4_]) {
                _fi = ON_ClassArray<ON_BrepVertex>::operator[]
                                ((ON_ClassArray<ON_BrepVertex> *)(fids_local + 4),
                                 pOStack_60->m_vi[V._4_4_]);
                memset(&_fi->m_vertex_user,0,8);
                (_fi->m_vertex_user).i = new_fids_local._4_4_;
              }
            }
            for (F_local._4_4_ = 0; iVar1 = F_local._4_4_,
                iVar2 = ON_SimpleArray<int>::Count(&pOStack_60->m_ti), iVar1 < iVar2;
                F_local._4_4_ = F_local._4_4_ + 1) {
              pOVar4 = (ON_ClassArray<ON_BrepTrim> *)(fids_local + 6);
              piVar3 = ON_SimpleArray<int>::operator[](&pOStack_60->m_ti,F_local._4_4_);
              this_02 = ON_ClassArray<ON_BrepTrim>::operator[](pOVar4,*piVar3);
              F_local._0_4_ = ON_BrepTrim::FaceIndexOf(this_02);
              if ((-1 < (int)F_local) &&
                 (pOVar5 = ON_ClassArray<ON_BrepFace>::operator[]
                                     ((ON_ClassArray<ON_BrepFace> *)(fids_local + 8),(int)F_local),
                 (pOVar5->m_face_user).i != new_fids_local._4_4_)) {
                pOVar5 = ON_ClassArray<ON_BrepFace>::operator[]
                                   ((ON_ClassArray<ON_BrepFace> *)(fids_local + 8),(int)F_local);
                memset(&pOVar5->m_face_user,0,8);
                (pOVar5->m_face_user).i = new_fids_local._4_4_;
                ON_SimpleArray<int>::Append(pOStack_28,(int *)&F_local);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void PropagateLabel(const ON_Brep& B, 
  const ON_SimpleArray<int>& fids,
  int label, 
  ON_SimpleArray<int>& new_fids
)

//on input, each face in fids must have m_face_user.i = label
{
  if (fids.Count() == 0) 
    return;
  new_fids.SetCount(0);
  new_fids.Reserve(B.m_F.Count());
  for (int face_i=0; face_i<fids.Count(); face_i++)
  {
    const ON_BrepFace& F = B.m_F[fids[face_i]];
    for (int loop_i=0; loop_i<F.m_li.Count(); loop_i++)
    {
      const ON_BrepLoop& L = B.m_L[F.m_li[loop_i]];
      memset(&L.m_loop_user,0,sizeof(L.m_loop_user));
      L.m_loop_user.i = label;
      for (int edge_i=0; edge_i<L.m_ti.Count(); edge_i++)
      {
        const ON_BrepTrim& T = B.m_T[L.m_ti[edge_i]];
        memset(&T.m_trim_user,0,sizeof(T.m_trim_user));
        T.m_trim_user.i = label;
        if (T.m_ei < 0) 
          continue;
        const ON_BrepEdge& E = B.m_E[T.m_ei];
        memset(&E.m_edge_user,0,sizeof(E.m_edge_user));
        E.m_edge_user.i = label;
        for (int vertex_i=0; vertex_i<2; vertex_i++)
        {
          if (E.m_vi[vertex_i] >= 0) 
          {
            const ON_BrepVertex& V = B.m_V[E.m_vi[vertex_i]];
            memset(&V.m_vertex_user,0,sizeof(V.m_vertex_user));
            V.m_vertex_user.i = label;
          }
        }
        for (int trim_i=0; trim_i<E.m_ti.Count(); trim_i++)
        {
          int fi = B.m_T[E.m_ti[trim_i]].FaceIndexOf();
          if (fi < 0 || B.m_F[fi].m_face_user.i == label) 
            continue;
          const ON_BrepFace& F_local = B.m_F[fi];
          memset(&F_local.m_face_user,0,sizeof(F_local.m_face_user));
          F_local.m_face_user.i = label;
          new_fids.Append(fi);
        }
      }
    }
  }
  return;
}